

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O0

void __thiscall FModelVertexBuffer::BindVBO(FModelVertexBuffer *this)

{
  FModelVertexBuffer *this_local;
  
  (*_ptrc_glBindBuffer)(0x8893,this->ibo_id);
  (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
  if ((gl.legacyMode & 1U) == 0) {
    (*_ptrc_glEnableVertexAttribArray)(0);
    (*_ptrc_glEnableVertexAttribArray)(1);
    (*_ptrc_glEnableVertexAttribArray)(3);
    (*_ptrc_glDisableVertexAttribArray)(2);
  }
  else {
    (*_ptrc_glEnableClientState)(0x8074);
    (*_ptrc_glEnableClientState)(0x8078);
    (*_ptrc_glDisableClientState)(0x8076);
  }
  return;
}

Assistant:

void FModelVertexBuffer::BindVBO()
{
	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, ibo_id);
	glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
	if (!gl.legacyMode)
	{
		glEnableVertexAttribArray(VATTR_VERTEX);
		glEnableVertexAttribArray(VATTR_TEXCOORD);
		glEnableVertexAttribArray(VATTR_VERTEX2);
		glDisableVertexAttribArray(VATTR_COLOR);
	}
	else
	{
		glEnableClientState(GL_VERTEX_ARRAY);
		glEnableClientState(GL_TEXTURE_COORD_ARRAY);
		glDisableClientState(GL_COLOR_ARRAY);
	}
}